

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

BOOL lists_equal(List *l1,List *l2)

{
  BOOL BVar1;
  bool local_21;
  List *l2_local;
  List *l1_local;
  
  if (l1 == l2) {
    l1_local._4_4_ = TRUE;
  }
  else if ((l1 == (List *)0x0) || (l2 == (List *)0x0)) {
    l1_local._4_4_ = FALSE;
  }
  else {
    BVar1 = tokens_equal(&l1->token,&l2->token);
    if (BVar1 == FALSE) {
      l1_local._4_4_ = FALSE;
    }
    else {
      BVar1 = lists_equal(l1->car,l2->car);
      local_21 = false;
      if (BVar1 != FALSE) {
        BVar1 = lists_equal(l1->cdr,l2->cdr);
        local_21 = BVar1 != FALSE;
      }
      l1_local._4_4_ = (BOOL)local_21;
    }
  }
  return l1_local._4_4_;
}

Assistant:

BOOL
lists_equal (const List *l1, const List *l2)
{
  if (l1 == l2)   /* Handles NULL == NULL case. */
    return TRUE;
  if (l1 == NULL || l2 == NULL)
    return FALSE;
  if (!tokens_equal (&l1->token, &l2->token))
    return FALSE;
  return lists_equal (l1->car, l2->car) && lists_equal (l1->cdr, l2->cdr);
}